

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Cube::setupBackFace(Cube *this)

{
  float local_58;
  float local_54;
  float backFace [18];
  Cube *this_local;
  
  local_58 = this->x;
  local_54 = this->y;
  backFace[0] = this->z;
  backFace[1] = this->x + this->l;
  backFace[2] = this->y;
  backFace[3] = this->z;
  backFace[4] = this->x + this->l;
  backFace[5] = this->y + this->h;
  backFace[6] = this->z;
  backFace[7] = this->x;
  backFace[8] = this->y;
  backFace[9] = this->z;
  backFace[10] = this->x + this->l;
  backFace[0xb] = this->y + this->h;
  backFace[0xc] = this->z;
  backFace[0xd] = this->x;
  backFace[0xe] = this->y + this->h;
  backFace[0xf] = this->z;
  backFace._64_8_ = this;
  arrayCopy(this,&local_58,this->positionData,0x12);
  return;
}

Assistant:

void setupBackFace() {
        float backFace[]={
            x,y,z,
            x+l,y,z,
            x+l,y+h,z,
            x,y,z,


            x+l,y+h,z,
            x,y+h,z
        };
        arrayCopy(backFace,positionData,18);
    }